

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O1

void __thiscall spvtools::opt::LoopUtils::CreateLoopDedicatedExits(LoopUtils *this)

{
  uint uVar1;
  IRContext *pIVar2;
  uint32_t *puVar3;
  pointer puVar4;
  pointer puVar5;
  BasicBlock *this_00;
  ulong uVar6;
  __node_base_ptr p_Var7;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> _Var8;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *pvVar9;
  DefUseManager *pDVar10;
  char cVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  mapped_type *ppBVar14;
  size_type sVar15;
  BasicBlock *pBVar16;
  mapped_type *ppBVar17;
  iterator instr;
  __node_base_ptr p_Var18;
  _Hash_node_base *p_Var19;
  _Hash_node_base *extraout_RAX;
  __node_base _Var20;
  ulong uVar21;
  uint32_t *puVar22;
  Loop *this_01;
  __node_base_ptr p_Var23;
  uint32_t *puVar24;
  pointer puVar25;
  Instruction *pIVar26;
  const_iterator __position;
  Instruction *pIVar27;
  long lVar28;
  bool bVar29;
  string message;
  BasicBlock *non_dedicate;
  InstructionBuilder builder;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  new_loop_exits;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_bb_set;
  _Any_data local_178;
  IRContext *local_168;
  code *pcStack_160;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_158;
  CFG *local_150;
  Instruction *local_148;
  Function *local_140;
  BasicBlock *local_138;
  uint32_t local_12c;
  InstructionBuilder local_128;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_100;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *pcStack_e0;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> *local_d8
  ;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *local_d0;
  LoopDescriptor *local_c8;
  DefUseManager *local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_b8;
  _Hash_node_base *local_b0;
  Instruction *local_a8;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_140 = this->loop_->loop_header_->function_;
  local_c8 = IRContext::GetLoopDescriptor(this->context_,local_140);
  pIVar2 = this->context_;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  local_150 = (pIVar2->cfg_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
              _M_t.
              super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
              .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar2 = this->context_;
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
  }
  local_c0 = (pIVar2->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  Loop::GetExitBlocks(this->loop_,
                      (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&local_68);
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  if (local_68._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
    pIVar27 = (Instruction *)0;
  }
  else {
    local_100 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&local_150->id2block_;
    local_d0 = &local_140->blocks_;
    local_148 = (Instruction *)0x0;
    _Var20._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      uVar12 = *(uint32_t *)&_Var20._M_nxt[1]._M_nxt;
      local_b0 = _Var20._M_nxt;
      local_178._0_4_ = uVar12;
      ppBVar14 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at(local_100,(key_type *)local_178._M_pod_data);
      local_158._M_head_impl = *ppBVar14;
      local_b8 = CFG::preds(local_150,uVar12);
      puVar22 = (local_b8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar3 = (local_b8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar28 = (long)puVar3 - (long)puVar22 >> 4;
      if (0 < lVar28) {
        lVar28 = lVar28 + 1;
        puVar22 = puVar22 + 2;
        do {
          puVar24 = puVar22;
          local_178._0_4_ = puVar24[-2];
          sVar15 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(&(this->loop_->loop_basic_blocks_)._M_h,
                           (key_type_conflict *)local_178._M_pod_data);
          if (sVar15 == 0) {
            puVar24 = puVar24 + -2;
            goto LAB_00253122;
          }
          local_178._0_4_ = puVar24[-1];
          sVar15 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(&(this->loop_->loop_basic_blocks_)._M_h,
                           (key_type_conflict *)local_178._M_pod_data);
          if (sVar15 == 0) {
            puVar24 = puVar24 + -1;
            goto LAB_00253122;
          }
          local_178._0_4_ = *puVar24;
          sVar15 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(&(this->loop_->loop_basic_blocks_)._M_h,
                           (key_type_conflict *)local_178._M_pod_data);
          if (sVar15 == 0) goto LAB_00253122;
          local_178._0_4_ = puVar24[1];
          sVar15 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(&(this->loop_->loop_basic_blocks_)._M_h,
                           (key_type_conflict *)local_178._M_pod_data);
          if (sVar15 == 0) {
            puVar24 = puVar24 + 1;
            goto LAB_00253122;
          }
          lVar28 = lVar28 + -1;
          puVar22 = puVar24 + 4;
        } while (1 < lVar28);
        puVar22 = puVar24 + 2;
      }
      lVar28 = (long)puVar3 - (long)puVar22 >> 2;
      if (lVar28 == 1) {
LAB_002530f0:
        local_178._0_4_ = *puVar22;
        sVar15 = std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&(this->loop_->loop_basic_blocks_)._M_h,
                         (key_type_conflict *)local_178._M_pod_data);
        puVar24 = puVar22;
        if (sVar15 != 0) {
          puVar24 = puVar3;
        }
      }
      else if (lVar28 == 2) {
LAB_002530d1:
        local_178._0_4_ = *puVar22;
        sVar15 = std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&(this->loop_->loop_basic_blocks_)._M_h,
                         (key_type_conflict *)local_178._M_pod_data);
        puVar24 = puVar22;
        if (sVar15 != 0) {
          puVar22 = puVar22 + 1;
          goto LAB_002530f0;
        }
      }
      else {
        puVar24 = puVar3;
        if (lVar28 == 3) {
          local_178._0_4_ = *puVar22;
          sVar15 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(&(this->loop_->loop_basic_blocks_)._M_h,
                           (key_type_conflict *)local_178._M_pod_data);
          puVar24 = puVar22;
          if (sVar15 != 0) {
            puVar22 = puVar22 + 1;
            goto LAB_002530d1;
          }
        }
      }
LAB_00253122:
      if (puVar24 == puVar3) {
        local_178._M_unused._M_object = &local_a0;
        std::
        _Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spvtools::opt::BasicBlock*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::BasicBlock*,false>>>>
                  ((_Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_178._M_unused._0_8_,&local_158,&local_178);
      }
      else {
        __position._M_current =
             (local_140->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = (local_140->blocks_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar29 = __position._M_current == puVar4;
        if (bVar29) {
LAB_00253761:
          __assert_fail("insert_pt != function->end() && \"Basic Block not found\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp"
                        ,0x15f,"void spvtools::opt::LoopUtils::CreateLoopDedicatedExits()");
        }
        pBVar16 = ((__position._M_current)->_M_t).
                  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        while (pBVar16 != local_158._M_head_impl) {
          __position._M_current = __position._M_current + 1;
          bVar29 = __position._M_current == puVar4;
          if (bVar29) goto LAB_00253761;
          pBVar16 = ((__position._M_current)->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        }
        if (bVar29) goto LAB_00253761;
        pBVar16 = (BasicBlock *)operator_new(0x88);
        local_148 = (Instruction *)operator_new(0x70);
        pIVar2 = this->context_;
        uVar12 = Module::TakeNextIdBound
                           ((pIVar2->module_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
        if ((uVar12 == 0) &&
           ((pIVar2->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
          local_d8 = &pIVar2->consumer_;
          local_178._M_unused._M_object = &local_168;
          local_128.context_ = (IRContext *)0x25;
          local_12c = uVar12;
          local_178._M_unused._0_8_ =
               (undefined8)
               std::__cxx11::string::_M_create((ulong *)local_178._M_pod_data,(ulong)&local_128);
          local_168 = local_128.context_;
          *(undefined8 *)local_178._M_unused._0_8_ = 0x667265766f204449;
          *(undefined8 *)((long)local_178._M_unused._0_8_ + 8) = 0x797254202e776f6c;
          *(undefined8 *)((long)local_178._M_unused._0_8_ + 0x10) = 0x676e696e6e757220;
          *(undefined8 *)((long)local_178._M_unused._0_8_ + 0x18) = 0x746361706d6f6320;
          builtin_strncpy((char *)((long)local_178._M_unused._0_8_ + 0x1d),"act-ids.",8);
          local_178._8_8_ = local_128.context_;
          *(char *)((long)&(local_128.context_)->syntax_context_ + (long)local_178._M_unused._0_8_)
               = '\0';
          local_128.context_ = (IRContext *)0x0;
          local_128.parent_ = (BasicBlock *)0x0;
          local_128.insert_before_.super_iterator.node_ = (iterator)(Instruction *)0x0;
          std::
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
          operator()(local_d8,SPV_MSG_ERROR,"",(spv_position_t *)&local_128,
                     (char *)local_178._M_unused._0_8_);
          uVar12 = local_12c;
          if ((IRContext **)local_178._M_unused._0_8_ != &local_168) {
            operator_delete(local_178._M_unused._M_object,
                            (ulong)((long)&local_168->syntax_context_ + 1));
            uVar12 = local_12c;
          }
        }
        pIVar27 = local_148;
        local_178._M_unused._M_object = (BasicBlock *)0x0;
        local_178._8_8_ = (BasicBlock *)0x0;
        local_168 = (IRContext *)0x0;
        Instruction::Instruction(local_148,pIVar2,OpLabel,0,uVar12,(OperandList *)&local_178);
        pvVar9 = local_d0;
        pBVar16->function_ = (Function *)0x0;
        (pBVar16->label_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar27;
        pIVar27 = &(pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = (Instruction *)0x0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
             (_func_int **)&PTR__Instruction_003e9ae0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.unique_id_ = 0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_ =
             (IRContext *)0x0;
        *(undefined8 *)
         ((long)&(pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 context_ + 6) = 0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        *(pointer *)
         ((long)&(pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 operands_.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
        *(pointer *)
         ((long)&(pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 operands_.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(pointer *)
         ((long)&(pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 dbg_line_insts_.
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
        *(pointer *)
         ((long)&(pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 dbg_line_insts_.
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
        lexical_scope_ = 0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
        inlined_at_ = 0;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar27;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar27;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
        (pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList =
             (_func_int **)&PTR__InstructionList_003e9b78;
        puVar4 = (local_d0->
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_138 = pBVar16;
        std::
        vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ::_M_insert_rval(local_d0,__position,(value_type *)&local_138);
        pBVar16 = *(BasicBlock **)
                   ((long)__position._M_current +
                   ((long)(pvVar9->
                          super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start - (long)puVar4));
        if (local_138 != (BasicBlock *)0x0) {
          std::default_delete<spvtools::opt::BasicBlock>::operator()
                    ((default_delete<spvtools::opt::BasicBlock> *)&local_138,local_138);
        }
        local_138 = (BasicBlock *)0x0;
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &local_178);
        pBVar16->function_ = local_140;
        puVar5 = (local_b8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
        for (puVar25 = (local_b8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start; pDVar10 = local_c0,
            puVar25 != puVar5; puVar25 = puVar25 + 1) {
          uVar1 = *puVar25;
          local_178._0_4_ = uVar1;
          sVar15 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(&(this->loop_->loop_basic_blocks_)._M_h,
                           (key_type_conflict *)local_178._M_pod_data);
          if (sVar15 != 0) {
            ppBVar14 = std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::at(local_100,(key_type *)local_178._M_pod_data);
            this_00 = *ppBVar14;
            local_178._M_unused._M_function_pointer = (_func_void *)local_158._M_head_impl;
            pcStack_160 = std::
                          _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:364:43)>
                          ::_M_invoke;
            local_168 = (IRContext *)
                        std::
                        _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:364:43)>
                        ::_M_manager;
            local_178._8_8_ = pBVar16;
            BasicBlock::ForEachSuccessorLabel(this_00,(function<void_(unsigned_int_*)> *)&local_178)
            ;
            if (local_168 != (IRContext *)0x0) {
              (*(code *)local_168)(&local_178,&local_178,3);
            }
            CFG::RegisterBlock(local_150,this_00);
          }
        }
        analysis::DefUseManager::AnalyzeInstDefUse
                  (local_c0,(Instruction *)
                            (pBVar16->label_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  );
        local_178._M_unused._0_8_ =
             (undefined8)
             (pBVar16->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ;
        if ((this->context_->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
          ppBVar17 = std::__detail::
                     _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&this->context_->instr_to_block_,(key_type *)&local_178);
          *ppBVar17 = pBVar16;
        }
        local_128.context_ = this->context_;
        local_128.insert_before_.super_iterator.node_ =
             (iterator)&(pBVar16->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
        local_128.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
        pIVar27 = ((local_158._M_head_impl)->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar12 = 0;
        local_128.parent_ = pBVar16;
        if (pIVar27->has_result_id_ == true) {
          uVar12 = Instruction::GetSingleWordOperand(pIVar27,(uint)pIVar27->has_type_id_);
        }
        instr.node_ = InstructionBuilder::AddBranch(&local_128,uVar12);
        local_128.parent_ = IRContext::get_instr_block(local_128.context_,instr.node_);
        _Var8._M_head_impl = local_158._M_head_impl;
        local_e8 = (code *)0x0;
        pcStack_e0 = (code *)0x0;
        local_f8._M_head_impl = (Instruction *)0x0;
        uStack_f0 = 0;
        local_128.insert_before_.super_iterator.node_ = (iterator)(iterator)instr.node_;
        local_f8._M_head_impl = (Instruction *)operator_new(0x20);
        ((local_f8._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase = (_func_int **)&local_128;
        ((local_f8._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
             (Instruction *)pBVar16;
        ((local_f8._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        previous_node_ = (Instruction *)pDVar10;
        *(LoopUtils **)
         &((local_f8._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
          is_sentinel_ = this;
        pcStack_e0 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:384:9)>
                     ::_M_invoke;
        local_e8 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:384:9)>
                   ::_M_manager;
        local_178._8_8_ = 0;
        local_178._M_unused._M_object = &local_f8;
        pcStack_160 = std::
                      _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                      ::_M_invoke;
        local_168 = (IRContext *)
                    std::
                    _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                    ::_M_manager;
        pIVar27 = ((_Var8._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                  sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        if ((pIVar27 != (Instruction *)0x0) &&
           ((pIVar27->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
          do {
            if (pIVar27 == (Instruction *)0x0) break;
            pIVar26 = (pIVar27->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
            cVar11 = '\0';
            if ((pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false
               ) {
              pIVar26 = (Instruction *)0x0;
            }
            if (pIVar27->opcode_ == OpPhi) {
              local_a8 = pIVar27;
              if (local_168 == (IRContext *)0x0) {
                std::__throw_bad_function_call();
              }
              cVar11 = (*pcStack_160)(&local_178,(uint **)&local_a8);
              if (cVar11 != '\0') {
                pIVar27 = pIVar26;
              }
            }
          } while (cVar11 != '\0');
        }
        if (local_168 != (IRContext *)0x0) {
          (*(code *)local_168)(&local_178,&local_178,3);
        }
        if (local_e8 != (code *)0x0) {
          (*local_e8)(&local_f8,&local_f8,3);
        }
        CFG::RegisterBlock(local_150,pBVar16);
        pIVar27 = ((local_158._M_head_impl)->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar13 = 0;
        uVar12 = 0;
        if (pIVar27->has_result_id_ == true) {
          uVar12 = Instruction::GetSingleWordOperand(pIVar27,(uint)pIVar27->has_type_id_);
        }
        CFG::RemoveNonExistingEdges(local_150,uVar12);
        local_178._M_unused._M_object = &local_a0;
        local_f8._M_head_impl = (Instruction *)pBVar16;
        std::
        _Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spvtools::opt::BasicBlock*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::BasicBlock*,false>>>>
                  ((_Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_178._M_unused._0_8_,&local_f8,&local_178);
        pIVar27 = ((local_158._M_head_impl)->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        if (pIVar27->has_result_id_ == true) {
          uVar13 = Instruction::GetSingleWordOperand(pIVar27,(uint)pIVar27->has_type_id_);
        }
        uVar6 = (local_c8->basic_block_to_loop_)._M_h._M_bucket_count;
        uVar21 = (ulong)uVar13 % uVar6;
        p_Var7 = (local_c8->basic_block_to_loop_)._M_h._M_buckets[uVar21];
        p_Var18 = (__node_base_ptr)0x0;
        if ((p_Var7 != (__node_base_ptr)0x0) &&
           (p_Var18 = p_Var7, p_Var23 = p_Var7->_M_nxt, *(uint *)&p_Var7->_M_nxt[1]._M_nxt != uVar13
           )) {
          while (p_Var19 = p_Var23->_M_nxt, p_Var19 != (_Hash_node_base *)0x0) {
            p_Var18 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var19[1]._M_nxt % uVar6 != uVar21) ||
               (p_Var18 = p_Var23, p_Var23 = p_Var19, *(uint *)&p_Var19[1]._M_nxt == uVar13))
            goto LAB_002536b7;
          }
          p_Var18 = (__node_base_ptr)0x0;
        }
LAB_002536b7:
        if (p_Var18 == (__node_base_ptr)0x0) {
          p_Var19 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var19 = p_Var18->_M_nxt;
        }
        if (p_Var19 == (_Hash_node_base *)0x0) {
          this_01 = (Loop *)0x0;
        }
        else {
          this_01 = (Loop *)p_Var19[2]._M_nxt;
        }
        if (this_01 != (Loop *)0x0) {
          Loop::AddBasicBlock(this_01,pBVar16);
          p_Var19 = extraout_RAX;
        }
        local_148 = (Instruction *)CONCAT71((int7)((ulong)p_Var19 >> 8),1);
      }
      _Var20._M_nxt = local_b0->_M_nxt;
      pIVar27 = local_148;
    } while (_Var20._M_nxt != (_Hash_node_base *)0x0);
  }
  if (local_a0._M_element_count == 1) {
    Loop::SetMergeBlock(this->loop_,(BasicBlock *)local_a0._M_before_begin._M_nxt[1]._M_nxt);
  }
  if (((ulong)pIVar27 & 1) != 0) {
    IRContext::InvalidateAnalysesExceptFor
              (this->context_,
               kAnalysisLoopAnalysis|kAnalysisCFG|kAnalysisInstrToBlockMapping|kAnalysisBegin);
  }
  std::
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a0);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void LoopUtils::CreateLoopDedicatedExits() {
  Function* function = loop_->GetHeaderBlock()->GetParent();
  LoopDescriptor& loop_desc = *context_->GetLoopDescriptor(function);
  CFG& cfg = *context_->cfg();
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  const IRContext::Analysis PreservedAnalyses =
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping;

  // Gathers the set of basic block that are not in this loop and have at least
  // one predecessor in the loop and one not in the loop.
  std::unordered_set<uint32_t> exit_bb_set;
  loop_->GetExitBlocks(&exit_bb_set);

  std::unordered_set<BasicBlock*> new_loop_exits;
  bool made_change = false;
  // For each block, we create a new one that gathers all branches from
  // the loop and fall into the block.
  for (uint32_t non_dedicate_id : exit_bb_set) {
    BasicBlock* non_dedicate = cfg.block(non_dedicate_id);
    const std::vector<uint32_t>& bb_pred = cfg.preds(non_dedicate_id);
    // Ignore the block if all the predecessors are in the loop.
    if (std::all_of(bb_pred.begin(), bb_pred.end(),
                    [this](uint32_t id) { return loop_->IsInsideLoop(id); })) {
      new_loop_exits.insert(non_dedicate);
      continue;
    }

    made_change = true;
    Function::iterator insert_pt = function->begin();
    for (; insert_pt != function->end() && &*insert_pt != non_dedicate;
         ++insert_pt) {
    }
    assert(insert_pt != function->end() && "Basic Block not found");

    // Create the dedicate exit basic block.
    // TODO(1841): Handle id overflow.
    BasicBlock& exit = *insert_pt.InsertBefore(std::unique_ptr<BasicBlock>(
        new BasicBlock(std::unique_ptr<Instruction>(new Instruction(
            context_, spv::Op::OpLabel, 0, context_->TakeNextId(), {})))));
    exit.SetParent(function);

    // Redirect in loop predecessors to |exit| block.
    for (uint32_t exit_pred_id : bb_pred) {
      if (loop_->IsInsideLoop(exit_pred_id)) {
        BasicBlock* pred_block = cfg.block(exit_pred_id);
        pred_block->ForEachSuccessorLabel([non_dedicate, &exit](uint32_t* id) {
          if (*id == non_dedicate->id()) *id = exit.id();
        });
        // Update the CFG.
        // |non_dedicate|'s predecessor list will be updated at the end of the
        // loop.
        cfg.RegisterBlock(pred_block);
      }
    }

    // Register the label to the def/use manager, requires for the phi patching.
    def_use_mgr->AnalyzeInstDefUse(exit.GetLabelInst());
    context_->set_instr_block(exit.GetLabelInst(), &exit);

    InstructionBuilder builder(context_, &exit, PreservedAnalyses);
    // Now jump from our dedicate basic block to the old exit.
    // We also reset the insert point so all instructions are inserted before
    // the branch.
    builder.SetInsertPoint(builder.AddBranch(non_dedicate->id()));
    non_dedicate->ForEachPhiInst(
        [&builder, &exit, def_use_mgr, this](Instruction* phi) {
          // New phi operands for this instruction.
          std::vector<uint32_t> new_phi_op;
          // Phi operands for the dedicated exit block.
          std::vector<uint32_t> exit_phi_op;
          for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
            uint32_t def_id = phi->GetSingleWordInOperand(i);
            uint32_t incoming_id = phi->GetSingleWordInOperand(i + 1);
            if (loop_->IsInsideLoop(incoming_id)) {
              exit_phi_op.push_back(def_id);
              exit_phi_op.push_back(incoming_id);
            } else {
              new_phi_op.push_back(def_id);
              new_phi_op.push_back(incoming_id);
            }
          }

          // Build the new phi instruction dedicated exit block.
          Instruction* exit_phi = builder.AddPhi(phi->type_id(), exit_phi_op);
          // Build the new incoming branch.
          new_phi_op.push_back(exit_phi->result_id());
          new_phi_op.push_back(exit.id());
          // Rewrite operands.
          uint32_t idx = 0;
          for (; idx < new_phi_op.size(); idx++)
            phi->SetInOperand(idx, {new_phi_op[idx]});
          // Remove extra operands, from last to first (more efficient).
          for (uint32_t j = phi->NumInOperands() - 1; j >= idx; j--)
            phi->RemoveInOperand(j);
          // Update the def/use manager for this |phi|.
          def_use_mgr->AnalyzeInstUse(phi);
        });
    // Update the CFG.
    cfg.RegisterBlock(&exit);
    cfg.RemoveNonExistingEdges(non_dedicate->id());
    new_loop_exits.insert(&exit);
    // If non_dedicate is in a loop, add the new dedicated exit in that loop.
    if (Loop* parent_loop = loop_desc[non_dedicate])
      parent_loop->AddBasicBlock(&exit);
  }

  if (new_loop_exits.size() == 1) {
    loop_->SetMergeBlock(*new_loop_exits.begin());
  }

  if (made_change) {
    context_->InvalidateAnalysesExceptFor(
        PreservedAnalyses | IRContext::kAnalysisCFG |
        IRContext::Analysis::kAnalysisLoopAnalysis);
  }
}